

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
TextField::writeXml_abi_cxx11_(string *__return_storage_ptr__,TextField *this,int indent)

{
  int indent_00;
  ostream *poVar1;
  int level;
  int level_00;
  stringstream str;
  allocator local_431;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Util::getIndent_abi_cxx11_(&local_430,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_1a0,(string *)&local_430);
  std::operator<<(poVar1,"<TextField");
  std::__cxx11::string::~string((string *)&local_430);
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b0);
  poVar1 = std::operator<<(local_1a0,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_1d0,"Text",(allocator *)&local_430);
  std::__cxx11::string::string((string *)&local_1f0,(string *)&this->text);
  indent_00 = indent + 1;
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b0,indent_00,&local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_210,"TextColor",&local_431);
  Color::writeXml(&local_430,&this->textColor,indent_00,&local_210);
  std::operator<<(local_1a0,(string *)&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"TextFontData",&local_431);
  FontData::writeXml(&local_430,&this->textFont,indent_00,&local_230);
  std::operator<<(local_1a0,(string *)&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"InputMode",(allocator *)&local_430);
  Util::writeXmlElement<int>((stringstream *)local_1b0,indent_00,&local_250,this->textInputMode);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_270,"PasswordMode",(allocator *)&local_430);
  Util::writeXmlElement<bool>((stringstream *)local_1b0,indent_00,&local_270,this->passwordMode);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string((string *)&local_290,"AcceptsReturn",(allocator *)&local_430);
  Util::writeXmlElement<bool>((stringstream *)local_1b0,indent_00,&local_290,this->acceptsReturn);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_2b0,"ImeWindowTitle",(allocator *)&local_430);
  std::__cxx11::string::string((string *)&local_2d0,(string *)&this->imeWindowTitle);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b0,indent_00,&local_2b0,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_2f0,"ImeEnterLabel",(allocator *)&local_430);
  Util::writeXmlElement<int>((stringstream *)local_1b0,indent_00,&local_2f0,this->imeEnterLabel);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string((string *)&local_310,"ImeWindowMode",(allocator *)&local_430);
  Util::writeXmlElement<int>((stringstream *)local_1b0,indent_00,&local_310,this->imeWindowMode);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string((string *)&local_330,"Placeholder",(allocator *)&local_430);
  std::__cxx11::string::string((string *)&local_350,(string *)&this->placeholder);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b0,indent_00,&local_330,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string((string *)&local_370,"PlaceHolderColor",&local_431);
  Color::writeXml(&local_430,&this->placeHolderColor,indent_00,&local_370);
  std::operator<<(local_1a0,(string *)&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&local_390,"PlaceholderFont",&local_431);
  FontData::writeXml(&local_430,&this->placeholderFont,indent_00,&local_390);
  std::operator<<(local_1a0,(string *)&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string((string *)&local_3b0,"TextTrimming",(allocator *)&local_430);
  Util::writeXmlElement<TextTrimming>
            ((stringstream *)local_1b0,indent_00,&local_3b0,this->textTrimming);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::string((string *)&local_3d0,"LineBreak",(allocator *)&local_430);
  Util::writeXmlElement<LineBreak>((stringstream *)local_1b0,indent_00,&local_3d0,this->lineBreak);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string((string *)&local_3f0,"HorizontalAlignment",(allocator *)&local_430);
  Util::writeXmlElement<HorizontalAlignment>
            ((stringstream *)local_1b0,indent_00,&local_3f0,this->horizontalAlignment);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string((string *)&local_410,"VerticalAlignment",(allocator *)&local_430);
  Util::writeXmlElement<VerticalAlignment>
            ((stringstream *)local_1b0,indent_00,&local_410,this->verticalAlignment);
  std::__cxx11::string::~string((string *)&local_410);
  Util::getIndent_abi_cxx11_(&local_430,(Util *)(ulong)(uint)indent,level_00);
  poVar1 = std::operator<<(local_1a0,(string *)&local_430);
  std::operator<<(poVar1,"</TextField>");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string TextField::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<TextField";
	writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "Text", text);
	str << textColor.writeXml(indent + 1, "TextColor");
	str << textFont.writeXml(indent + 1, "TextFontData");
	Util::writeXmlElement(str, indent + 1, "InputMode", textInputMode);
	Util::writeXmlElement(str, indent + 1, "PasswordMode", passwordMode);
	Util::writeXmlElement(str, indent + 1, "AcceptsReturn", acceptsReturn);
	Util::writeXmlElement(str, indent + 1, "ImeWindowTitle", imeWindowTitle);
	Util::writeXmlElement(str, indent + 1, "ImeEnterLabel", imeEnterLabel);
	Util::writeXmlElement(str, indent + 1, "ImeWindowMode", imeWindowMode);
	Util::writeXmlElement(str, indent + 1, "Placeholder", placeholder);
	str << placeHolderColor.writeXml(indent + 1, "PlaceHolderColor");
	str << placeholderFont.writeXml(indent + 1, "PlaceholderFont");
	Util::writeXmlElement(str, indent + 1, "TextTrimming", textTrimming);
	Util::writeXmlElement(str, indent + 1, "LineBreak", lineBreak);
	Util::writeXmlElement(str, indent + 1, "HorizontalAlignment", horizontalAlignment);
	Util::writeXmlElement(str, indent + 1, "VerticalAlignment", verticalAlignment);

	str << Util::getIndent(indent) << "</TextField>";

	return str.str();
}